

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn-state-machine.cc
# Opt level: O3

void __thiscall dynet::RNNStateMachine::failure(RNNStateMachine *this,RNNOp op)

{
  ostream *this_00;
  invalid_argument *this_01;
  ostringstream oss;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"State transition error: currently in state ",0x2b);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)local_198,this->q_);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," but received operation ",0x18);
  std::ostream::operator<<((ostream *)this_00,op);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_01,asStack_1b8);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void RNNStateMachine::failure(RNNOp op) {
  ostringstream oss; oss << "State transition error: currently in state " << q_ << " but received operation " << op;
  throw std::invalid_argument(oss.str());
}